

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid_column_reader.hpp
# Opt level: O2

hugeint_t duckdb::UUIDValueConversion::PlainRead<false>(ByteBuffer *plain_data,ColumnReader *reader)

{
  hugeint_t hVar1;
  
  hVar1 = ReadParquetUUID(plain_data->ptr);
  plain_data->len = plain_data->len - 0x10;
  plain_data->ptr = plain_data->ptr + 0x10;
  return hVar1;
}

Assistant:

static hugeint_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		if (CHECKED) {
			plain_data.available(sizeof(hugeint_t));
		}
		auto res = ReadParquetUUID(const_data_ptr_cast(plain_data.ptr));
		plain_data.unsafe_inc(sizeof(hugeint_t));
		return res;
	}